

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void exe_reconstructor::fixupdecompressor::
     decompressrelocstring<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      last,DwordVector *relocs)

{
  bool bVar1;
  byte *pbVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  uint local_68;
  byte local_62;
  byte local_61;
  uint32_t value_1;
  bool bit5;
  bool bit6;
  uchar *local_58;
  uint32_t local_4c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_48;
  uint32_t value;
  int local_3c;
  int local_38;
  uint32_t count;
  uint32_t increment;
  bool bit7;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  p;
  uint32_t base;
  DwordVector *relocs_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_local;
  
  p._M_current._4_4_ = 0;
  _increment = first._M_current;
  relocs_local = (DwordVector *)last._M_current;
  last_local._M_current = first._M_current;
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&increment,
                            (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&relocs_local), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&increment);
    count._3_1_ = (*pbVar2 & 0x80) != 0;
    if ((bool)count._3_1_) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&increment);
      local_38 = (((int)(uint)*pbVar2 >> 5 & 3U) + 1) * 4;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&increment);
      local_3c = (*pbVar2 & 0x1f) + 1;
      _Stack_48 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&increment,0);
      local_4c = 0;
      local_58 = _increment;
      _value_1 = relocs_local;
      sVar3 = getrelocvalue<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (&local_4c,0,_increment,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )relocs_local);
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&increment,sVar3);
      p._M_current._4_4_ = local_4c + p._M_current._4_4_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (relocs,(value_type_conflict3 *)((long)&p._M_current + 4));
      while (iVar5 = local_3c + -1, bVar1 = local_3c != 0, local_3c = iVar5, bVar1) {
        p._M_current._4_4_ = local_38 + p._M_current._4_4_;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (relocs,(value_type_conflict3 *)((long)&p._M_current + 4));
      }
    }
    else {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&increment);
      local_61 = (*pbVar2 & 0x40) != 0;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&increment);
      local_62 = (*pbVar2 & 0x20) != 0;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&increment);
      local_68 = *pbVar2 & 0x1f;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&increment,0);
      if ((local_62 & 1) != 0) {
        sVar3 = getrelocvalue<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (&local_68,5,_increment,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )relocs_local);
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+=((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&increment,sVar3);
      }
      if ((local_61 & 1) == 0) {
        uVar4 = __gnu_cxx::operator-
                          ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&increment,&last_local);
        printf("NOTE: unexpected compressed reloc with bit6=0 [%04x] b7:b6:b5=%d%d%d base=%08x val=%08x\n"
               ,uVar4 & 0xffffffff,(ulong)(count._3_1_ & 1),(ulong)(local_61 & 1),
               (ulong)(local_62 & 1),(ulong)p._M_current._4_4_,local_68);
        p._M_current._4_4_ = local_68;
      }
      else {
        p._M_current._4_4_ = local_68 + p._M_current._4_4_;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (relocs,(value_type_conflict3 *)((long)&p._M_current + 4));
    }
  }
  return;
}

Assistant:

static void decompressrelocstring(ITER first, ITER last, DwordVector& relocs)
        {
            //printf("decompressrelocstring(%04x)\n", int(last-first));
            uint32_t base=0;
            ITER p= first;
            while (p<last) {
                //printf("%04x:<%02x>", int(p-first), *p);
                bool bit7= *p&0x80;
                if (bit7) {
                    uint32_t increment= 4*(((*p>>5)&3)+1);
                    uint32_t count= (*p&0x1f)+1;
                    p++;
                    uint32_t value= 0;
                    p+=getrelocvalue(value, 0, p, last);

                    base += value;
                    relocs.push_back(base);
                    while (count--) {
                        base += increment;
                        relocs.push_back(base);
                    }
                }
                else {
                    bool bit6= *p&0x40;
                    bool bit5= *p&0x20;

                    uint32_t value= *p&0x1f;
                    p++;
                    if (bit5)
                        p+=getrelocvalue(value, 5, p, last);

                    if (bit6)
                        base += value;
                    else {
                        printf("NOTE: unexpected compressed reloc with bit6=0 [%04x] b7:b6:b5=%d%d%d base=%08x val=%08x\n", int(p-first), bit7, bit6, bit5, base, value);
                        base = value;
                    }
                    relocs.push_back(base);
                }
            }
            //printf("reloc end base->%08x\n", base);
        }